

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

config_value *
parser_resolve_array_values(parser *parser,char **value_items,size_t value_items_length)

{
  config_value *value;
  config_value *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char **ppcVar5;
  
  value = config_value_create_array(value_items_length);
  if (value == (config_value *)0x0) {
LAB_00107725:
    value = (config_value *)0x0;
  }
  else if (value_items_length != 0) {
    sVar3 = 0;
    sVar4 = value_items_length;
    ppcVar5 = value_items;
    do {
      pcVar1 = parser_parse_value(parser,value_items[sVar3]);
      if (pcVar1 == (config_value *)0x0) {
        sVar2 = 0;
        do {
          free(ppcVar5[sVar2]);
          sVar2 = sVar2 + 1;
        } while (sVar4 != sVar2);
        config_value_destroy(value);
      }
      else {
        ((value->data).array)->values[sVar3] = pcVar1;
      }
      if (pcVar1 == (config_value *)0x0) goto LAB_00107725;
      sVar3 = sVar3 + 1;
      sVar4 = sVar4 - 1;
      ppcVar5 = ppcVar5 + 1;
    } while (sVar3 != value_items_length);
  }
  return value;
}

Assistant:

static struct config_value *parser_resolve_array_values(struct parser *parser, char **value_items,
                                                        size_t value_items_length)
{
        struct config_value *config_value = config_value_create_array(value_items_length);

        if (config_value == NULL) {
                return NULL;
        }

        // Resolve and insert config_values into the array
        for (size_t i = 0; i < value_items_length; ++i) {
                struct config_value *item = parser_parse_value(parser, value_items[i]);

                if (item == NULL) {
                        for (size_t j = i; j < value_items_length; ++j) {
                                free(value_items[j]);
                        }

                        config_value_destroy(config_value);

                        return NULL;
                }

                config_value->data.array->values[i] = item;
        }

        return config_value;
}